

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_perform_user(connectdata *conn)

{
  CURLcode CVar1;
  imapstate iVar2;
  char *pcVar3;
  
  iVar2 = IMAP_STOP;
  if ((conn->bits).user_passwd == true) {
    pcVar3 = "";
    if (conn->user != (char *)0x0) {
      pcVar3 = conn->user;
    }
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"USER %s",pcVar3);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    iVar2 = IMAP_LIST;
  }
  (conn->proto).imapc.state = iVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_perform_user(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Send the USER command */
  result = Curl_pp_sendf(&conn->proto.pop3c.pp, "USER %s",
                         conn->user ? conn->user : "");
  if(!result)
    state(conn, POP3_USER);

  return result;
}